

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O1

void __thiscall
autoSimplification_associative1_Test::~autoSimplification_associative1_Test
          (autoSimplification_associative1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, associative1)
{
    auto const w = symbol("w");
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const z = symbol("z");
    auto const e = (w + x) + (y + z);
    EXPECT_EQ(toString(e), "(+ w x y z)");
}